

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef::IfcRectangleHollowProfileDef
          (IfcRectangleHollowProfileDef *this)

{
  *(undefined ***)&this->field_0xc8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xd0 = 0;
  *(char **)&this->field_0xd8 = "IfcRectangleHollowProfileDef";
  IfcRectangleProfileDef::IfcRectangleProfileDef
            (&this->super_IfcRectangleProfileDef,&PTR_construction_vtable_24__007dbd00);
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x98 = 0;
  (this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7dbc48;
  *(undefined8 *)&this->field_0xc8 = 0x7dbce8;
  *(undefined8 *)
   &(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x58 = 0x7dbc70;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       0x7dbc98;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x90 = 0x7dbcc0;
  (this->InnerFilletRadius).have = false;
  (this->OuterFilletRadius).have = false;
  return;
}

Assistant:

IfcRectangleHollowProfileDef() : Object("IfcRectangleHollowProfileDef") {}